

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAM.cpp
# Opt level: O0

RealType __thiscall
OpenMD::EAM::Zhou2001Functional
          (EAM *this,RealType rho,RealType rhoe,vector<double,_std::allocator<double>_> *Fn,
          vector<double,_std::allocator<double>_> *F,RealType Fe,RealType eta)

{
  double dVar1;
  reference pvVar2;
  double in_XMM0_Qa;
  double dVar3;
  double dVar4;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  double in_XMM3_Qa;
  RealType t;
  RealType functional;
  RealType rho0;
  RealType rhon;
  size_type in_stack_ffffffffffffff28;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff30;
  undefined8 local_50;
  
  dVar3 = in_XMM1_Qa * 0.85;
  local_50 = 0.0;
  if (dVar3 <= in_XMM0_Qa) {
    if ((in_XMM0_Qa < dVar3) || (in_XMM1_Qa * 1.15 <= in_XMM0_Qa)) {
      if (in_XMM1_Qa * 1.15 <= in_XMM0_Qa) {
        dVar3 = pow(in_XMM0_Qa / in_XMM1_Qa,in_XMM3_Qa);
        dVar3 = log(dVar3);
        in_XMM2_Qa = in_XMM2_Qa * (1.0 - dVar3);
        local_50 = pow(in_XMM0_Qa / in_XMM1_Qa,in_XMM3_Qa);
        local_50 = in_XMM2_Qa * local_50;
      }
    }
    else {
      dVar4 = in_XMM0_Qa / in_XMM1_Qa - 1.0;
      pvVar2 = std::vector<double,_std::allocator<double>_>::at
                         (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      local_50 = *pvVar2;
      pvVar2 = std::vector<double,_std::allocator<double>_>::at
                         (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      dVar3 = *pvVar2;
      pvVar2 = std::vector<double,_std::allocator<double>_>::at
                         (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      dVar1 = *pvVar2;
      pvVar2 = std::vector<double,_std::allocator<double>_>::at
                         (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      local_50 = dVar4 * (dVar4 * (dVar4 * *pvVar2 + dVar1) + dVar3) + local_50;
    }
  }
  else {
    dVar4 = in_XMM0_Qa / dVar3 - 1.0;
    pvVar2 = std::vector<double,_std::allocator<double>_>::at
                       (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    local_50 = *pvVar2;
    pvVar2 = std::vector<double,_std::allocator<double>_>::at
                       (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    dVar3 = *pvVar2;
    pvVar2 = std::vector<double,_std::allocator<double>_>::at
                       (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    dVar1 = *pvVar2;
    pvVar2 = std::vector<double,_std::allocator<double>_>::at
                       (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    local_50 = dVar4 * (dVar4 * (dVar4 * *pvVar2 + dVar1) + dVar3) + local_50;
  }
  return local_50;
}

Assistant:

RealType EAM::Zhou2001Functional(RealType rho, RealType rhoe,
                                   std::vector<RealType> Fn,
                                   std::vector<RealType> F, RealType Fe,
                                   RealType eta) {
    RealType rhon = 0.85 * rhoe;
    RealType rho0 = 1.15 * rhoe;
    RealType functional(0.0);
    RealType t;
    if (rho < rhon) {
      t          = rho / rhon - 1.0;
      functional = Fn.at(0) + t * (Fn.at(1) + t * (Fn.at(2) + t * Fn.at(3)));
    } else if (rho >= rhon && rho < rho0) {
      t          = rho / rhoe - 1.0;
      functional = F.at(0) + t * (F.at(1) + t * (F.at(2) + t * F.at(3)));
    } else if (rho >= rho0) {
      t          = rho / rhoe;
      functional = Fe * (1.0 - log(pow(t, eta))) * pow(t, eta);
    }
    return functional;
  }